

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.c
# Opt level: O2

void test_counter_non_zero(testing t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  int iVar4;
  nsync_counter c;
  char *pcVar5;
  ulong in_RCX;
  ulong uVar7;
  nsync_time nVar8;
  nsync_time nVar9;
  nsync_time nVar10;
  __syscall_slong_t _Var6;
  
  c = nsync::nsync_counter_new(1);
  uVar3 = nsync::nsync_counter_value(c);
  if (uVar3 != 1) {
    pcVar5 = smprintf("counter is not 1 (test)");
    in_RCX = 0x33;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x33,pcVar5);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RCX;
  uVar3 = nsync::nsync_counter_wait((nsync *)c,(nsync_counter)0x0,(nsync_time)(auVar1 << 0x40));
  if (uVar3 != 1) {
    pcVar5 = smprintf("counter is not 1 (poll)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x36,pcVar5);
  }
  nVar8 = nsync::nsync_time_now();
  nVar9 = nsync::nsync_time_now();
  nVar10 = nsync::nsync_time_ms(1000);
  _Var6 = nVar10.tv_nsec;
  nVar9 = nsync::nsync_time_add(nVar9,nVar10);
  nVar10.tv_sec = nVar9.tv_nsec;
  nVar10.tv_nsec = _Var6;
  uVar3 = nsync::nsync_counter_wait((nsync *)c,(nsync_counter)nVar9.tv_sec,nVar10);
  if (uVar3 != 1) {
    pcVar5 = smprintf("counter is not 1 (1s wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x3b,pcVar5);
  }
  nVar9 = nsync::nsync_time_now();
  nVar8 = nsync::nsync_time_sub(nVar9,nVar8);
  nVar9 = nsync::nsync_time_ms(900);
  iVar4 = nsync::nsync_time_cmp(nVar8,nVar9);
  if (iVar4 < 0) {
    pcVar5 = nsync_time_str(nVar8,2);
    pcVar5 = smprintf("timed wait on non-zero counter returned too quickly (1s wait took %s)",pcVar5
                     );
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x40,pcVar5);
  }
  nVar9 = nsync::nsync_time_ms(2000);
  uVar7 = nVar9.tv_nsec;
  iVar4 = nsync::nsync_time_cmp(nVar8,nVar9);
  if (0 < iVar4) {
    pcVar5 = nsync_time_str(nVar8,2);
    pcVar5 = smprintf("timed wait on non-zero counter returned too slowly (1s wait took %s)",pcVar5)
    ;
    uVar7 = 0x44;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x44,pcVar5);
  }
  uVar3 = nsync::nsync_counter_add(c,-1);
  if (uVar3 != 0) {
    pcVar5 = smprintf("zero counter note is not 0 (add)");
    uVar7 = 0x48;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x48,pcVar5);
  }
  uVar3 = nsync::nsync_counter_value(c);
  if (uVar3 != 0) {
    pcVar5 = smprintf("zero counter note is not 0 (test)");
    uVar7 = 0x4c;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x4c,pcVar5);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar3 = nsync::nsync_counter_wait((nsync *)c,(nsync_counter)0x0,(nsync_time)(auVar2 << 0x40));
  if (uVar3 != 0) {
    pcVar5 = smprintf("zero counter note is not 0 (poll)");
    uVar7 = 0x4f;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x4f,pcVar5);
  }
  nVar8.tv_nsec = uVar7;
  nVar8.tv_sec = 999999999;
  uVar3 = nsync::nsync_counter_wait((nsync *)c,(nsync_counter)0x7fffffffffffffff,nVar8);
  if (uVar3 != 0) {
    pcVar5 = smprintf("zero counter note is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x52,pcVar5);
  }
  nsync::nsync_counter_free(c);
  return;
}

Assistant:

static void test_counter_non_zero (testing t) {
	nsync_time start;
	nsync_time waited;
	nsync_time abs_deadline;
	nsync_counter c = nsync_counter_new (1);
	if (nsync_counter_value (c) != 1) {
		TEST_ERROR (t, ("counter is not 1 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 1) {
		TEST_ERROR (t, ("counter is not 1 (poll)"));
	}
	start = nsync_time_now ();
	abs_deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (1000));
	if (nsync_counter_wait (c, abs_deadline) != 1) {
		TEST_ERROR (t, ("counter is not 1 (1s wait)"));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("timed wait on non-zero counter returned too quickly (1s wait took %s)",
			   nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("timed wait on non-zero counter returned too slowly (1s wait took %s)",
			   nsync_time_str (waited, 2)));
	}

	if (nsync_counter_add (c, -1) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (add)"));
	}

	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("zero counter note is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);
}